

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O0

uint64_t get_capacity(string *drive)

{
  int __fd;
  int iVar1;
  char *__file;
  string *psStack_20;
  int fin;
  uint64_t ret;
  string *drive_local;
  
  psStack_20 = (string *)0x0;
  ret = (uint64_t)drive;
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0);
  if (__fd == 0) {
    drive_local = (string *)0x0;
  }
  else {
    iVar1 = ioctl(__fd,0x80081272,&stack0xffffffffffffffe0);
    if (iVar1 == 0) {
      close(__fd);
      drive_local = psStack_20;
    }
    else {
      close(__fd);
      drive_local = (string *)0x0;
    }
  }
  return (uint64_t)drive_local;
}

Assistant:

uint64_t get_capacity(string drive)
{
#ifdef BLKGETSIZE64
	uint64_t ret = 0;
#elif MACOS_BUILD
	uint64_t ret = 0;
#else
	uint32_t ret = 0;
#endif
	int fin = open(drive.c_str(), O_RDONLY);
	if (!fin)
		return 0;

#ifdef BLKGETSIZE64
	if (ioctl(fin, BLKGETSIZE64, &ret)) {
		close(fin);
		return 0;
	}
#else
	if (ioctl(fin, BLKGETSIZE, &ret)) {
		close(fin);
		return 0;
	}
	ret *= 512;
#endif
	close(fin);

	return ret;
}